

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sap_Emu.cpp
# Opt level: O2

void __thiscall Sap_Emu::cpu_write_(Sap_Emu *this,sap_addr_t addr,int data)

{
  state_t *psVar1;
  Sap_Apu *this_00;
  uint time;
  
  if ((addr ^ 0xd200) < 10) {
    this_00 = &this->apu;
    psVar1 = (this->super_Sap_Cpu).state;
    time = psVar1->base + psVar1->time & this->time_mask;
  }
  else {
    if ((9 < (addr ^ 0xd210)) || ((this->info).stereo != true)) {
      return;
    }
    psVar1 = (this->super_Sap_Cpu).state;
    this_00 = &this->apu2;
    time = psVar1->base + psVar1->time & this->time_mask;
    addr = addr ^ 0x10;
  }
  Sap_Apu::write_data(this_00,time,addr,data);
  return;
}

Assistant:

void Sap_Emu::cpu_write_( sap_addr_t addr, int data )
{
	if ( (addr ^ Sap_Apu::start_addr) <= (Sap_Apu::end_addr - Sap_Apu::start_addr) )
	{
		GME_APU_HOOK( this, addr - Sap_Apu::start_addr, data );
		apu.write_data( time() & time_mask, addr, data );
		return;
	}
	
	if ( (addr ^ (Sap_Apu::start_addr + 0x10)) <= (Sap_Apu::end_addr - Sap_Apu::start_addr) &&
			info.stereo )
	{
		GME_APU_HOOK( this, addr - 0x10 - Sap_Apu::start_addr + 10, data );
		apu2.write_data( time() & time_mask, addr ^ 0x10, data );
		return;
	}

	if ( (addr & ~0x0010) != 0xD20F || data != 0x03 )
		debug_printf( "Unmapped write $%04X <- $%02X\n", addr, data );
}